

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape_string.cpp
# Opt level: O3

string_view libtorrent::trim(string_view str)

{
  void *pvVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  char *in_RSI;
  ulong in_RDI;
  string_view sVar6;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_30._M_len = in_RDI;
  local_30._M_str = in_RSI;
  if (in_RDI != 0) {
    uVar4 = 0;
    do {
      pvVar1 = memchr(" \t\n\r",(int)in_RSI[uVar4],4);
      if (pvVar1 == (void *)0x0) {
        sVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                          (&local_30," \t\n\r",0xffffffffffffffff,4);
        if (uVar4 == 0xffffffffffffffff) goto LAB_001b579b;
        sVar5 = uVar4;
        if (local_30._M_len < uVar4) {
          ::std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     uVar4);
        }
        goto LAB_001b57aa;
      }
      uVar4 = uVar4 + 1;
    } while (in_RDI != uVar4);
  }
  sVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                    (&local_30," \t\n\r",0xffffffffffffffff,4);
LAB_001b579b:
  uVar4 = 0xffffffffffffffff;
  sVar5 = local_30._M_len;
LAB_001b57aa:
  uVar3 = (sVar2 - uVar4) + 1;
  uVar4 = local_30._M_len - sVar5;
  if (uVar3 <= local_30._M_len - sVar5) {
    uVar4 = uVar3;
  }
  sVar6._M_str = local_30._M_str + sVar5;
  sVar6._M_len = uVar4;
  return sVar6;
}

Assistant:

string_view trim(string_view str)
	{
		auto const first = str.find_first_not_of(" \t\n\r");
		auto const last = str.find_last_not_of(" \t\n\r");
		return str.substr(first == string_view::npos ? str.size() : first, last - first + 1);
	}